

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGString::parse(SVGString *this,string_view input)

{
  string_view local_20;
  
  local_20._M_str = input._M_str;
  local_20._M_len = input._M_len;
  stripLeadingAndTrailingSpaces(&local_20);
  std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
            ((string *)&this->m_value,&local_20);
  return true;
}

Assistant:

bool SVGString::parse(std::string_view input)
{
    stripLeadingAndTrailingSpaces(input);
    m_value.assign(input);
    return true;
}